

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O0

void __thiscall duckdb::WindowExpression::Serialize(WindowExpression *this,Serializer *serializer)

{
  Serializer *in_RSI;
  Serializer *in_RDI;
  Serializer *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 uVar1;
  Serializer *pSVar2;
  field_id_t field_id;
  
  pSVar2 = in_RDI;
  ParsedExpression::Serialize((ParsedExpression *)unaff_retaddr,in_RDI);
  field_id = (field_id_t)((ulong)pSVar2 >> 0x30);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             in_stack_ffffffffffffffd8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             in_stack_ffffffffffffffd8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             in_stack_ffffffffffffffd8);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)in_stack_ffffffffffffffd8);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)in_stack_ffffffffffffffd8);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (vector<duckdb::OrderByNode,_true> *)in_stack_ffffffffffffffd8);
  Serializer::WriteProperty<duckdb::WindowBoundary>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (WindowBoundary *)in_stack_ffffffffffffffd8);
  Serializer::WriteProperty<duckdb::WindowBoundary>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (WindowBoundary *)in_stack_ffffffffffffffd8);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffffd8);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffffd8);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffffd8);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffffd8);
  Serializer::WritePropertyWithDefault<bool>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (bool *)in_stack_ffffffffffffffd8);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_RSI,CONCAT11(in_stack_ffffffffffffffef,in_stack_ffffffffffffffee),(char *)in_RDI,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffffd8);
  uVar1 = 0;
  Serializer::WritePropertyWithDefault<duckdb::WindowExcludeMode>
            (unaff_retaddr,field_id,(char *)in_RSI,
             (WindowExcludeMode *)
             (ulong)CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8),
             (WindowExcludeMode *)in_RDI);
  Serializer::WritePropertyWithDefault<bool>
            (in_RSI,CONCAT11(uVar1,in_stack_ffffffffffffffee),(char *)in_RDI,
             (bool *)in_stack_ffffffffffffffd8);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (in_RSI,CONCAT11(uVar1,in_stack_ffffffffffffffee),(char *)in_RDI,
             (vector<duckdb::OrderByNode,_true> *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void WindowExpression::Serialize(Serializer &serializer) const {
	ParsedExpression::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "function_name", function_name);
	serializer.WritePropertyWithDefault<string>(201, "schema", schema);
	serializer.WritePropertyWithDefault<string>(202, "catalog", catalog);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(203, "children", children);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(204, "partitions", partitions);
	serializer.WritePropertyWithDefault<vector<OrderByNode>>(205, "orders", orders);
	serializer.WriteProperty<WindowBoundary>(206, "start", start);
	serializer.WriteProperty<WindowBoundary>(207, "end", end);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(208, "start_expr", start_expr);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(209, "end_expr", end_expr);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(210, "offset_expr", offset_expr);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(211, "default_expr", default_expr);
	serializer.WritePropertyWithDefault<bool>(212, "ignore_nulls", ignore_nulls);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(213, "filter_expr", filter_expr);
	serializer.WritePropertyWithDefault<WindowExcludeMode>(214, "exclude_clause", exclude_clause, WindowExcludeMode::NO_OTHER);
	serializer.WritePropertyWithDefault<bool>(215, "distinct", distinct);
	serializer.WritePropertyWithDefault<vector<OrderByNode>>(216, "arg_orders", arg_orders);
}